

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MercatorTile.cpp
# Opt level: O2

vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *
mercatortile::tiles(vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>
                    *__return_storage_ptr__,LngLatBbox *llbbox,int *zoom)

{
  double dVar1;
  int iVar2;
  pointer piVar3;
  int *piVar4;
  int iVar5;
  ulong uVar6;
  pointer piVar7;
  pointer pLVar8;
  ulong uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  Tile TVar12;
  Tile TVar13;
  vector<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_> bboxes;
  vector<int,_std::allocator<int>_> y;
  vector<int,_std::allocator<int>_> x;
  double n;
  double e;
  double s;
  double w;
  _Vector_base<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_> local_c8;
  _Vector_base<int,_std::allocator<int>_> local_b0;
  Tile local_94;
  LngLatBbox local_88;
  pointer local_68;
  pointer local_60;
  int *local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (llbbox->west <= llbbox->east) {
    std::vector<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>::push_back
              ((vector<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_> *)
               &local_c8,llbbox);
  }
  else {
    local_88.west = -180.0;
    local_88.south = llbbox->south;
    local_88.north = llbbox->north;
    local_88.east = llbbox->east;
    std::vector<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>::
    emplace_back<mercatortile::LngLatBbox>
              ((vector<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_> *)
               &local_c8,&local_88);
    local_88.west = llbbox->west;
    local_88.south = llbbox->south;
    local_88.east = 180.0;
    local_88.north = llbbox->north;
    std::vector<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>::
    emplace_back<mercatortile::LngLatBbox>
              ((vector<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_> *)
               &local_c8,&local_88);
  }
  (__return_storage_ptr__->
  super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68 = local_c8._M_impl.super__Vector_impl_data._M_finish;
  pLVar8 = local_c8._M_impl.super__Vector_impl_data._M_start;
  while (pLVar8 != local_68) {
    dVar1 = pLVar8->west;
    uVar10 = SUB84(dVar1,0);
    uVar11 = (undefined4)((ulong)dVar1 >> 0x20);
    local_40 = pLVar8->south;
    local_48 = pLVar8->east;
    local_50 = pLVar8->north;
    if (dVar1 <= -180.0) {
      uVar10 = 0;
      uVar11 = 0xc0668000;
    }
    local_38 = (double)CONCAT44(uVar11,uVar10);
    if (local_40 <= -85.051129) {
      local_40 = -85.051129;
    }
    if (180.0 <= local_48) {
      local_48 = 180.0;
    }
    if (85.051129 <= local_50) {
      local_50 = 85.051129;
    }
    TVar12 = tile(&local_38,&local_40,zoom);
    local_60 = pLVar8;
    TVar13 = tile(&local_48,&local_50,zoom);
    uVar9 = 0;
    if (0 < TVar12.x) {
      uVar9 = TVar12._0_8_ & 0xffffffff;
    }
    uVar6 = TVar13._0_8_ >> 0x20;
    if (TVar13.y == 0 || (long)TVar13._0_8_ < 0) {
      uVar6 = 0;
    }
    iVar2 = TVar13.x + 1;
    dVar1 = ldexp(1.0,*zoom);
    iVar5 = (int)dVar1;
    if (iVar2 < (int)dVar1) {
      iVar5 = iVar2;
    }
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_88,(long)(iVar5 - (int)uVar9),
               (allocator_type *)&local_b0);
    for (piVar4 = (int *)local_88.west; piVar4 != (int *)local_88.south; piVar4 = piVar4 + 1) {
      *piVar4 = (int)uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    }
    iVar5 = TVar12.y + 1;
    dVar1 = ldexp(1.0,*zoom);
    if ((int)dVar1 <= iVar5) {
      iVar5 = (int)dVar1;
    }
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_b0,(long)(iVar5 - (int)uVar6),
               (allocator_type *)&local_94);
    for (piVar3 = local_b0._M_impl.super__Vector_impl_data._M_start;
        piVar3 != local_b0._M_impl.super__Vector_impl_data._M_finish; piVar3 = piVar3 + 1) {
      *piVar3 = (int)uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    }
    local_58 = (int *)local_88.south;
    for (piVar4 = (int *)local_88.west; piVar3 = local_b0._M_impl.super__Vector_impl_data._M_finish,
        piVar4 != local_58; piVar4 = piVar4 + 1) {
      iVar5 = *piVar4;
      for (piVar7 = local_b0._M_impl.super__Vector_impl_data._M_start; piVar7 != piVar3;
          piVar7 = piVar7 + 1) {
        local_94.y = *piVar7;
        local_94.z = *zoom;
        local_94.x = iVar5;
        std::vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::
        emplace_back<mercatortile::Tile>(__return_storage_ptr__,&local_94);
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_b0);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_88);
    pLVar8 = local_60 + 1;
  }
  std::_Vector_base<mercatortile::LngLatBbox,_std::allocator<mercatortile::LngLatBbox>_>::
  ~_Vector_base(&local_c8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Tile> tiles(const LngLatBbox &llbbox, const int &zoom)
{
    vector<LngLatBbox> bboxes;
    if (llbbox.west > llbbox.east)
    {
        bboxes.push_back(LngLatBbox{-180.0, llbbox.south, llbbox.east, llbbox.north});
        bboxes.push_back(LngLatBbox{llbbox.west, llbbox.south, 180.0, llbbox.north});
    }
    else
    {
        bboxes.push_back(llbbox);
    }

    vector<Tile> return_tiles;
    for (auto bbox : bboxes)
    {
        double w = max(-180.0, bbox.west);
        double s = max(-85.051129, bbox.south);
        double e = min(180.0, bbox.east);
        double n = min(85.051129, bbox.north);

        Tile ll = tile(w, s, zoom);
        Tile ur = tile(e, n, zoom);

        // Clamp left x and top y at 0.
        int llx = (ll.x < 0) ? 0 : ll.x;
        int ury = (ur.y < 0) ? 0 : ur.y;

        std::vector<int> x(min(ur.x + 1, int(pow(2, zoom))) - llx);
        std::iota(std::begin(x), std::end(x), llx);
        std::vector<int> y(min(ll.y + 1, int(pow(2, zoom))) - ury);
        std::iota(std::begin(y), std::end(y), ury);

        for (auto i : x)
        {
            for (auto j : y)
            {
                return_tiles.push_back(Tile{i, j, zoom});
            }
        }
    }
    return return_tiles;
}